

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O3

void Fl::repeat_timeout(double time,Fl_Timeout_Handler cb,void *argp)

{
  Timeout *pTVar1;
  Timeout *pTVar2;
  Timeout *pTVar3;
  Timeout **ppTVar4;
  double dVar5;
  
  dVar5 = (double)(~-(ulong)(time + missed_timeout_by < -0.05) & (ulong)(time + missed_timeout_by));
  if (free_timeout == (Timeout *)0x0) {
    pTVar1 = (Timeout *)operator_new(0x20);
  }
  else {
    pTVar1 = free_timeout;
    free_timeout = free_timeout->next;
  }
  pTVar1->time = dVar5;
  pTVar1->cb = cb;
  pTVar1->arg = argp;
  ppTVar4 = &first_timeout;
  if (first_timeout == (Timeout *)0x0) {
    pTVar3 = (Timeout *)0x0;
  }
  else {
    pTVar3 = first_timeout;
    if (first_timeout->time <= dVar5) {
      do {
        pTVar2 = pTVar3;
        pTVar3 = pTVar2->next;
        if (pTVar3 == (Timeout *)0x0) {
          pTVar3 = (Timeout *)0x0;
          break;
        }
      } while (pTVar3->time <= dVar5);
      ppTVar4 = &pTVar2->next;
    }
  }
  pTVar1->next = pTVar3;
  *ppTVar4 = pTVar1;
  return;
}

Assistant:

void Fl::repeat_timeout(double time, Fl_Timeout_Handler cb, void *argp) {
  time += missed_timeout_by; if (time < -.05) time = 0;
  Timeout* t = free_timeout;
  if (t) {
      free_timeout = t->next;
  } else {
      t = new Timeout;
  }
  t->time = time;
  t->cb = cb;
  t->arg = argp;
  // insert-sort the new timeout:
  Timeout** p = &first_timeout;
  while (*p && (*p)->time <= time) p = &((*p)->next);
  t->next = *p;
  *p = t;
}